

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::GetConfigurations
          (string *__return_storage_ptr__,cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,bool singleConfig)

{
  int iVar1;
  char *__s;
  string *__x;
  allocator<char> local_41;
  string local_40;
  
  iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])();
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_BUILD_TYPE",&local_41);
    __x = GetSafeDefinition(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((singleConfig) && (__x->_M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(configs,__x);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__x);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CMAKE_CONFIGURATION_TYPES",&local_41);
    __s = GetDefinition(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
      cmSystemTools::ExpandListArgument(&local_40,configs,false);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetConfigurations(std::vector<std::string>& configs,
                                          bool singleConfig) const
{
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    if (const char* configTypes =
          this->GetDefinition("CMAKE_CONFIGURATION_TYPES")) {
      cmSystemTools::ExpandListArgument(configTypes, configs);
    }
    return "";
  }
  const std::string& buildType = this->GetSafeDefinition("CMAKE_BUILD_TYPE");
  if (singleConfig && !buildType.empty()) {
    configs.push_back(buildType);
  }
  return buildType;
}